

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_map.hpp
# Opt level: O2

fixed_size_map_iterator<duckdb::list_entry_t,_false> * __thiscall
duckdb::fixed_size_map_iterator<duckdb::list_entry_t,_false>::operator++
          (fixed_size_map_iterator<duckdb::list_entry_t,_false> *this)

{
  uchar *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  iVar5 = this->entry_idx;
  uVar2 = this->idx_in_entry + 1;
  this->idx_in_entry = uVar2;
  if (uVar2 == 8) {
    iVar5 = iVar5 + 1;
    this->entry_idx = iVar5;
    this->idx_in_entry = 0;
    uVar2 = 0;
  }
  uVar3 = this->map->capacity;
  uVar4 = uVar3 >> 3;
  uVar3 = (ulong)((uint)uVar3 & 7);
LAB_016c12f7:
  uVar6 = iVar5;
  if ((uVar6 < uVar4) || ((uVar6 == uVar4 && (uVar2 < uVar3)))) {
    puVar1 = (this->map->occupied).validity_mask;
    if (puVar1[uVar6] != '\0') goto code_r0x016c1311;
    if (uVar6 != uVar4) goto LAB_016c1338;
    this->idx_in_entry = uVar3;
  }
  return this;
code_r0x016c1311:
  uVar7 = 8;
  if (uVar6 == uVar4) {
    uVar7 = uVar3;
  }
  while (uVar2 < uVar7) {
    if ((puVar1[uVar6] >> ((uint)uVar2 & 0x1f) & 1) != 0) {
      return this;
    }
    uVar2 = uVar2 + 1;
    this->idx_in_entry = uVar2;
  }
  if ((uVar6 != uVar4) || (bVar8 = uVar3 != uVar2, uVar2 = uVar3, iVar5 = uVar4, bVar8)) {
LAB_016c1338:
    this->entry_idx = uVar6 + 1;
    this->idx_in_entry = 0;
    uVar2 = 0;
    iVar5 = uVar6 + 1;
  }
  goto LAB_016c12f7;
}

Assistant:

fixed_size_map_iterator &operator++() {
		// Prefix increment
		if (++idx_in_entry == occupied_mask::BITS_PER_VALUE) {
			NextEntry();
		}
		// Loop until we find an occupied index, or until the end
		auto end = map.end();
		while (*this < end) {
			const auto &entry = map.occupied.GetValidityEntryUnsafe(entry_idx);
			if (entry == static_cast<uint8_t>(~occupied_mask::ValidityBuffer::MAX_ENTRY)) {
				// Entire entry is unoccupied, skip
				if (entry_idx == end.entry_idx) {
					// This is the last entry
					idx_in_entry = end.idx_in_entry;
					break;
				}
				NextEntry();
			} else {
				// One or more occupied in entry, loop over it
				const auto idx_to = entry_idx == end.entry_idx ? end.idx_in_entry : occupied_mask::BITS_PER_VALUE;
				for (; idx_in_entry < idx_to; idx_in_entry++) {
					if (map.occupied.RowIsValid(entry, idx_in_entry)) {
						// We found an occupied index
						return *this;
					}
				}
				// We did not find an occupied index
				if (*this != end) {
					NextEntry();
				}
			}
		}
		return *this;
	}